

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser * init_parse_meth(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"name str name",parse_meth_name);
  parser_reg(p_00,"cut uint cut",parse_meth_cut);
  parser_reg(p_00,"stun uint stun",parse_meth_stun);
  parser_reg(p_00,"miss uint miss",parse_meth_miss);
  parser_reg(p_00,"phys uint phys",parse_meth_phys);
  parser_reg(p_00,"msg ?str msg",parse_meth_message_type);
  parser_reg(p_00,"act str act",parse_meth_act_msg);
  parser_reg(p_00,"desc str desc",parse_meth_desc);
  return p_00;
}

Assistant:

static struct parser *init_parse_meth(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_meth_name);
	parser_reg(p, "cut uint cut", parse_meth_cut);
	parser_reg(p, "stun uint stun", parse_meth_stun);
	parser_reg(p, "miss uint miss", parse_meth_miss);
	parser_reg(p, "phys uint phys", parse_meth_phys);
	parser_reg(p, "msg ?str msg", parse_meth_message_type);
	parser_reg(p, "act str act", parse_meth_act_msg);
	parser_reg(p, "desc str desc", parse_meth_desc);
	return p;
}